

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_constant.cpp
# Opt level: O3

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundConstantExpression *expr,ExpressionExecutorState *root)

{
  ExpressionState *this_00;
  pointer this_01;
  pointer *__ptr;
  
  this_00 = (ExpressionState *)operator_new(0xb0);
  ExpressionState::ExpressionState(this_00,&expr->super_Expression,root);
  (this->expressions).
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  this_01 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
            ::operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                          *)this);
  ExpressionState::Finalize(this_01);
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundConstantExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExpressionState>(expr, root);
	result->Finalize();
	return result;
}